

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_naive_aggregator.cpp
# Opt level: O2

bool __thiscall duckdb::WindowNaiveState::KeyEqual(WindowNaiveState *this,idx_t *lidx,idx_t *ridx)

{
  unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true> *this_00;
  ulong uVar1;
  bool bVar2;
  int iVar3;
  pointer pWVar4;
  pointer pWVar5;
  ulong uVar6;
  ulong uVar7;
  reference pvVar8;
  idx_t iVar9;
  WindowCursor *local_170;
  sel_t f;
  sel_t r;
  sel_t l;
  SelectionVector fsel;
  SelectionVector rsel;
  SelectionVector lsel;
  Vector right;
  Vector left;
  
  uVar1 = *lidx;
  iVar9 = *ridx;
  this_00 = &(this->super_WindowAggregatorLocalState).cursor;
  pWVar4 = unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true>::
           operator->(this_00);
  uVar6 = (pWVar4->state).next_row_index;
  bVar2 = uVar1 < (pWVar4->state).current_row_index;
  pWVar4 = unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true>::
           operator->(this_00);
  pWVar5 = unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true>::
           operator->(this_00);
  uVar7 = uVar1;
  if (uVar1 < uVar6 && !bVar2) {
    uVar7 = iVar9;
  }
  iVar3 = (int)uVar1;
  if (uVar6 <= uVar1 || bVar2) {
    iVar3 = (int)iVar9;
  }
  l = iVar3 - (int)(pWVar5->state).current_row_index;
  SelectionVector::SelectionVector(&lsel,&l);
  local_170 = (this->super_WindowAggregatorLocalState).cursor.
              super_unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>_>.
              _M_t.
              super___uniq_ptr_impl<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>_>
              ._M_t.
              super__Tuple_impl<0UL,_duckdb::WindowCursor_*,_std::default_delete<duckdb::WindowCursor>_>
              .super__Head_base<0UL,_duckdb::WindowCursor_*,_false>._M_head_impl;
  pWVar5 = unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true>::
           operator->(this_00);
  if (((pWVar5->state).next_row_index <= uVar7) || (uVar7 < (pWVar5->state).current_row_index)) {
    local_170 = (this->comparer).
                super_unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>_>.
                _M_t.
                super___uniq_ptr_impl<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>_>
                ._M_t.
                super__Tuple_impl<0UL,_duckdb::WindowCursor_*,_std::default_delete<duckdb::WindowCursor>_>
                .super__Head_base<0UL,_duckdb::WindowCursor_*,_false>._M_head_impl;
    WindowCursor::Seek(local_170,uVar7);
  }
  r = (int)uVar7 - (int)(local_170->state).current_row_index;
  SelectionVector::SelectionVector(&rsel,&r);
  f = 0;
  SelectionVector::SelectionVector(&fsel,&f);
  uVar1 = 0;
  do {
    uVar6 = uVar1;
    uVar7 = ((long)(pWVar4->chunk).data.
                   super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                   super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                   super__Vector_impl_data._M_finish -
            (long)(pWVar4->chunk).data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                  .super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                  super__Vector_impl_data._M_start) / 0x68;
    if (uVar7 <= uVar6) break;
    pvVar8 = vector<duckdb::Vector,_true>::get<true>(&(pWVar4->chunk).data,uVar6);
    Vector::Vector(&left,pvVar8,&lsel,1);
    pvVar8 = vector<duckdb::Vector,_true>::get<true>(&(local_170->chunk).data,uVar6);
    Vector::Vector(&right,pvVar8,&rsel,1);
    iVar9 = VectorOperations::NotDistinctFrom
                      (&left,&right,(optional_ptr<const_duckdb::SelectionVector,_true>)0x0,1,
                       (optional_ptr<duckdb::SelectionVector,_true>)0x0,&fsel);
    Vector::~Vector(&right);
    Vector::~Vector(&left);
    uVar1 = uVar6 + 1;
  } while (iVar9 != 0);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&fsel.selection_data.internal.
              super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&rsel.selection_data.internal.
              super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&lsel.selection_data.internal.
              super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return uVar7 <= uVar6;
}

Assistant:

bool WindowNaiveState::KeyEqual(const idx_t &lidx, const idx_t &ridx) {
	//	One of the indices will be scanned, so make it the left one
	auto lhs = lidx;
	auto rhs = ridx;
	if (!cursor->RowIsVisible(lhs)) {
		std::swap(lhs, rhs);
		D_ASSERT(cursor->RowIsVisible(lhs));
	}

	auto &scanned = cursor->chunk;
	auto l = cursor->RowOffset(lhs);
	SelectionVector lsel(&l);

	auto rreader = cursor.get();
	if (!cursor->RowIsVisible(rhs)) {
		//	Values on different pages!
		rreader = comparer.get();
		rreader->Seek(rhs);
	}
	auto rscanned = &rreader->chunk;
	auto r = rreader->RowOffset(rhs);
	SelectionVector rsel(&r);

	sel_t f = 0;
	SelectionVector fsel(&f);

	for (column_t c = 0; c < scanned.ColumnCount(); ++c) {
		Vector left(scanned.data[c], lsel, 1);
		Vector right(rscanned->data[c], rsel, 1);
		if (!VectorOperations::NotDistinctFrom(left, right, nullptr, 1, nullptr, &fsel)) {
			return false;
		}
	}

	return true;
}